

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

unsigned_long_long __thiscall
ImGui::RoundScalarWithFormatT<unsigned_long_long,long_long>
          (ImGui *this,char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *pcVar1;
  ImGui IVar2;
  ImGui *pIVar3;
  undefined4 in_register_00000014;
  size_t fmt_out_size;
  char *src;
  double dVar4;
  char v_str [64];
  char fmt_sanitized [32];
  undefined8 local_80;
  char local_78 [64];
  char local_38 [40];
  
  local_80 = CONCAT44(in_register_00000014,data_type);
  do {
    IVar2 = *this;
    if (IVar2 == (ImGui)0x0) {
      fmt_out_size = 3;
      pIVar3 = (ImGui *)v;
    }
    else if ((IVar2 != (ImGui)0x25) || (fmt_out_size = 1, pIVar3 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar2 == (ImGui)0x25) + 1;
      fmt_out_size = 0;
      pIVar3 = (ImGui *)v;
    }
    v = (unsigned_long_long)pIVar3;
  } while ((int)fmt_out_size == 0);
  if ((int)fmt_out_size == 1) {
    this = pIVar3;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    SanitizeFormatString((char *)this,local_38,fmt_out_size);
    ImFormatString(local_78,0x40,local_38,local_80);
    src = (char *)((long)&local_80 + 7);
    do {
      pcVar1 = src + 1;
      src = src + 1;
    } while (*pcVar1 == ' ');
    if (((uint)format & 0xfffffffe) == 8) {
      dVar4 = atof(src);
      local_80 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    }
    else {
      ImAtoi<long_long>(src,&local_80);
    }
  }
  return local_80;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}